

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteKvIopageWrite(unqlite_page *pPage)

{
  Pager *pPager;
  Page *pPVar1;
  Page *pPVar2;
  Page *pPVar3;
  int iVar4;
  uint uVar5;
  sxu32 iNum;
  ulong uVar6;
  Page *pPVar7;
  void *pDest;
  Page **ppPVar8;
  char *zErr;
  unqlite *pDb;
  long lVar9;
  int local_144;
  Page *local_140;
  Page *local_138 [33];
  
  if (pPage == (unqlite_page *)0x0) {
    return 0;
  }
  pPager = (Pager *)pPage[1].zData;
  iVar4 = unqlitePagerBegin(pPager);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (pPager->iState == 2) {
    if ((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) {
      (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
      iVar4 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,6);
      if (iVar4 != 0) {
        unqliteGenErrorFormat
                  (pPager->pDb,"IO error while opening journal file: %s",pPager->zJournal);
        return iVar4;
      }
      pDest = SyMemBackendAlloc(pPager->pAllocator,pPager->iSectorSize);
      if (pDest == (void *)0x0) {
        iVar4 = -1;
LAB_00114b88:
        unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,0);
        pPager->pjfd = (unqlite_file *)0x0;
        return iVar4;
      }
      SyMemcpy(aJournalMagic,pDest,8);
      *(undefined4 *)((long)pDest + 8) = 0;
      uVar5 = pPager->cksumInit;
      *(uint *)((long)pDest + 0xc) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      SyBigEndianPack64((uchar *)((long)pDest + 0x10),pPager->dbOrigSize);
      uVar5 = pPager->iSectorSize;
      *(uint *)((long)pDest + 0x18) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar5 = pPager->iPageSize;
      *(uint *)((long)pDest + 0x1c) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      iVar4 = (*pPager->pjfd->pMethods->xWrite)(pPager->pjfd,pDest,(long)pPager->iSectorSize,0);
      pPager->iJournalOfft = (long)pPager->iSectorSize;
      SyMemBackendFree(pPager->pAllocator,pDest);
      if (iVar4 != 0) goto LAB_00114b88;
    }
    pPager->iState = 3;
  }
  if (0x7f < pPager->nHot) {
    local_144 = 0;
    iVar4 = unqliteFinalizeJournal(pPager,&local_144,0);
    if ((iVar4 == 0) && (pPager->pFirstHot != (Page *)0x0)) {
      SyZero(local_138,0x100);
      pPVar7 = pPager->pFirstHot;
LAB_00114844:
      if (pPVar7 != (Page *)0x0) {
        pPVar1 = pPVar7->pPrevHot;
        pPVar7->pPrevHot = (Page *)0x0;
        for (lVar9 = 0; lVar9 != 0x1f; lVar9 = lVar9 + 1) {
          if (local_138[lVar9] == (Page *)0x0) {
            local_138[lVar9] = pPVar7;
            pPVar7 = pPVar1;
            goto LAB_00114844;
          }
          pPVar7 = page_merge_hot(local_138[lVar9],pPVar7);
          local_138[lVar9] = (Page *)0x0;
        }
        local_138[0x1f] = page_merge_hot(local_138[0x1f],pPVar7);
        pPVar7 = pPVar1;
        goto LAB_00114844;
      }
      pPVar7 = local_138[0];
      for (lVar9 = 1; lVar9 != 0x20; lVar9 = lVar9 + 1) {
        pPVar7 = page_merge_hot(pPVar7,local_138[lVar9]);
      }
      pPVar7->pNextHot = (Page *)0x0;
      if ((local_144 == 0) || (iVar4 = pager_wait_on_lock(pPager,4), iVar4 == 0)) {
        *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 2;
        local_140 = (Page *)pPage;
        while (pPVar7 != (Page *)0x0) {
          pPVar1 = pPVar7->pPrevHot;
          uVar5 = pPVar7->flags;
          if ((uVar5 & 8) == 0) {
            iVar4 = (*pPager->pfd->pMethods->xWrite)
                              (pPager->pfd,pPVar7->zData,(long)pPager->iPageSize,
                               pPVar7->pgno * (long)pPager->iPageSize);
            if (iVar4 != 0) {
              *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 1;
              unqliteGenError(pPager->pDb,
                              "IO error while writing hot dirty pages, rollback your database");
              unqliteGenError(pPager->pDb,"Please perform a rollback");
              return iVar4;
            }
            uVar5 = pPVar7->flags;
          }
          pPVar7->flags = uVar5 & 0xffffff91;
          pPVar2 = pPVar7->pDirtyNext;
          pPVar3 = pPVar7->pDirtyPrev;
          ppPVar8 = &pPVar3->pDirtyNext;
          if (pPVar3 == (Page *)0x0) {
            ppPVar8 = &pPager->pDirty;
          }
          *ppPVar8 = pPVar2;
          ppPVar8 = &pPVar2->pDirtyPrev;
          if (pPVar2 == (Page *)0x0) {
            ppPVar8 = &pPager->pFirstDirty;
          }
          *ppPVar8 = pPVar3;
          pager_unlink_page(pPager,pPVar7);
          pager_release_page(pPager,pPVar7);
          pPVar7 = pPVar1;
        }
        pPager->pHotDirty = (Page *)0x0;
        pPager->pFirstHot = (Page *)0x0;
        pPager->nHot = 0;
        pPage = (unqlite_page *)local_140;
      }
    }
  }
  if ((((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) &&
      (uVar6 = ((Page *)pPage)->pgno, uVar6 < pPager->dbOrigSize)) &&
     (iVar4 = unqliteBitvecTest(pPager->pVec,uVar6), iVar4 == 0)) {
    if (pPager->nRec == 0xffffffff) {
      pDb = pPager->pDb;
      zErr = "Journal record limit reached, commit your changes";
      goto LAB_00114802;
    }
    local_138[0] = (Page *)(uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                            (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                            (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38);
    iVar4 = (*pPager->pjfd->pMethods->xWrite)(pPager->pjfd,local_138,8,pPager->iJournalOfft);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = (*pPager->pjfd->pMethods->xWrite)
                      (pPager->pjfd,((Page *)pPage)->zData,(long)pPager->iPageSize,
                       pPager->iJournalOfft + 8);
    if (iVar4 != 0) {
      return iVar4;
    }
    iNum = pager_cksum(pPager,((Page *)pPage)->zData);
    iVar4 = WriteInt32(pPager->pjfd,iNum,(long)pPager->iPageSize + pPager->iJournalOfft + 8);
    if (iVar4 != 0) {
      return iVar4;
    }
    pPager->iJournalOfft = (long)pPager->iPageSize + pPager->iJournalOfft + 0xc;
    pPager->nRec = pPager->nRec + 1;
    unqliteBitvecSet(pPager->pVec,((Page *)pPage)->pgno);
  }
  pager_page_to_dirty_list(pPager,(Page *)pPage);
  uVar6 = ((Page *)pPage)->pgno + 1;
  if (uVar6 <= pPager->dbSize) {
    return 0;
  }
  pPager->dbSize = uVar6;
  if (uVar6 != 0xffffffffffffffff) {
    return 0;
  }
  pDb = pPager->pDb;
  zErr = "Database maximum page limit (64-bit) reached";
LAB_00114802:
  unqliteGenError(pDb,zErr);
  return -7;
}

Assistant:

static int unqliteKvIopageWrite(unqlite_page *pPage)
{
	int rc;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	rc = unqlitePageWrite(pPage);
	return rc;
}